

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O0

int jrtplib::GetAutoSockets
              (uint32_t bindIP,bool allowOdd,bool rtcpMux,SocketType *pRtpSock,SocketType *pRtcpSock
              ,uint16_t *pRtpPort,uint16_t *pRtcpPort)

{
  bool bVar1;
  ulong uVar2;
  size_t sVar3;
  int iVar4;
  size_type sVar5;
  reference pvVar6;
  ulong local_c8;
  size_t i_6;
  size_t i_5;
  bool possiblyValid;
  ulong uStack_b0;
  uint16_t secondPort;
  size_t i_4;
  ulong uStack_a0;
  SocketType sock2;
  size_t i_3;
  size_t i_2;
  int status;
  uint16_t basePort;
  size_t i_1;
  sockaddr_in addr;
  ulong local_60;
  size_t i;
  undefined1 local_50 [4];
  SocketType sock;
  vector<int,_std::allocator<int>_> toClose;
  int attempts;
  int maxAttempts;
  uint16_t *pRtpPort_local;
  SocketType *pRtcpSock_local;
  SocketType *pRtpSock_local;
  bool rtcpMux_local;
  int iStack_c;
  bool allowOdd_local;
  uint32_t bindIP_local;
  
  toClose.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0x400;
  toClose.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_50);
  do {
    if (0x3ff < (int)toClose.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage) {
      toClose.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ =
           (int)toClose.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 1;
      for (local_c8 = 0;
          sVar5 = std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)local_50), local_c8 < sVar5;
          local_c8 = local_c8 + 1) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_50,local_c8);
        close(*pvVar6);
      }
      iStack_c = -0xa1;
LAB_0017369f:
      addr.sin_zero[0] = '\x01';
      addr.sin_zero[1] = '\0';
      addr.sin_zero[2] = '\0';
      addr.sin_zero[3] = '\0';
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_50)
      ;
      return iStack_c;
    }
    toClose.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ =
         (int)toClose.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage + 1;
    i._4_4_ = socket(2,2,0);
    if (i._4_4_ == -1) {
      for (local_60 = 0;
          sVar5 = std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)local_50), local_60 < sVar5;
          local_60 = local_60 + 1) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_50,local_60);
        close(*pvVar6);
      }
      iStack_c = -0x4b;
      goto LAB_0017369f;
    }
    memset(&i_1,0,0x10);
    i_1._0_2_ = 2;
    i_1._2_2_ = 0;
    i_1._4_4_ = htonl(bindIP);
    iVar4 = bind(i._4_4_,(sockaddr *)&i_1,0x10);
    if (iVar4 != 0) {
      close(i._4_4_);
      for (_status = 0; uVar2 = _status,
          sVar5 = std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)local_50), uVar2 < sVar5;
          _status = _status + 1) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_50,_status);
        close(*pvVar6);
      }
      iStack_c = -0xa0;
      goto LAB_0017369f;
    }
    i_2._6_2_ = 0;
    i_2._0_4_ = GetIPv4SocketPort(i._4_4_,(uint16_t *)((long)&i_2 + 6));
    if ((int)i_2 < 0) {
      close(i._4_4_);
      for (i_3 = 0; sVar3 = i_3,
          sVar5 = std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)local_50), sVar3 < sVar5;
          i_3 = i_3 + 1) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_50,i_3);
        close(*pvVar6);
      }
      iStack_c = (int)i_2;
      goto LAB_0017369f;
    }
    if (rtcpMux) {
      if (((uint)i_2._6_2_ % 2 == 0) || (allowOdd)) {
        *pRtpSock = i._4_4_;
        *pRtcpSock = i._4_4_;
        *pRtpPort = i_2._6_2_;
        *pRtcpPort = i_2._6_2_;
        for (uStack_a0 = 0; uVar2 = uStack_a0,
            sVar5 = std::vector<int,_std::allocator<int>_>::size
                              ((vector<int,_std::allocator<int>_> *)local_50), uVar2 < sVar5;
            uStack_a0 = uStack_a0 + 1) {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_50,uStack_a0);
          close(*pvVar6);
        }
        iStack_c = 0;
        goto LAB_0017369f;
      }
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_50,
                 (value_type_conflict3 *)((long)&i + 4));
    }
    else {
      i_4._4_4_ = socket(2,2,0);
      if (i_4._4_4_ == -1) {
        close(i._4_4_);
        for (uStack_b0 = 0;
            sVar5 = std::vector<int,_std::allocator<int>_>::size
                              ((vector<int,_std::allocator<int>_> *)local_50), uStack_b0 < sVar5;
            uStack_b0 = uStack_b0 + 1) {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_50,uStack_b0);
          close(*pvVar6);
        }
        iStack_c = -0x4b;
        goto LAB_0017369f;
      }
      i_5._6_2_ = i_2._6_2_;
      if ((uint)i_2._6_2_ % 2 == 0) {
        i_5._6_2_ = i_2._6_2_ + 1;
        bVar1 = true;
      }
      else {
        bVar1 = 1 < i_2._6_2_;
        if (bVar1) {
          i_5._6_2_ = i_2._6_2_ - 1;
        }
      }
      if (bVar1) {
        memset(&i_1,0,0x10);
        i_1._0_2_ = 2;
        i_1._2_2_ = htons(i_5._6_2_);
        i_1._4_4_ = htonl(bindIP);
        iVar4 = bind(i_4._4_4_,(sockaddr *)&i_1,0x10);
        if (iVar4 == 0) {
          if (i_2._6_2_ < i_5._6_2_) {
            *pRtpSock = i._4_4_;
            *pRtcpSock = i_4._4_4_;
            *pRtpPort = i_2._6_2_;
            *pRtcpPort = i_5._6_2_;
          }
          else {
            *pRtpSock = i_4._4_4_;
            *pRtcpSock = i._4_4_;
            *pRtpPort = i_5._6_2_;
            *pRtcpPort = i_2._6_2_;
          }
          for (i_6 = 0; sVar5 = std::vector<int,_std::allocator<int>_>::size
                                          ((vector<int,_std::allocator<int>_> *)local_50),
              i_6 < sVar5; i_6 = i_6 + 1) {
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_50,i_6);
            close(*pvVar6);
          }
          iStack_c = 0;
          goto LAB_0017369f;
        }
      }
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_50,
                 (value_type_conflict3 *)((long)&i + 4));
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_50,
                 (value_type_conflict3 *)((long)&i_4 + 4));
    }
  } while( true );
}

Assistant:

int GetAutoSockets(uint32_t bindIP, bool allowOdd, bool rtcpMux,
                   SocketType *pRtpSock, SocketType *pRtcpSock, 
                   uint16_t *pRtpPort, uint16_t *pRtcpPort)
{
	const int maxAttempts = 1024;
	int attempts = 0;
	vector<SocketType> toClose;

	while (attempts++ < maxAttempts)
	{
		SocketType sock = socket(PF_INET, SOCK_DGRAM, 0);
		if (sock == RTPSOCKERR)
		{
			for (size_t i = 0 ; i < toClose.size() ; i++)
				RTPCLOSE(toClose[i]);
			return ERR_RTP_UDPV4TRANS_CANTCREATESOCKET;
		}

		// First we get an automatically chosen port

		struct sockaddr_in addr;
		memset(&addr,0,sizeof(struct sockaddr_in));

		addr.sin_family = AF_INET;
		addr.sin_port = 0;
		addr.sin_addr.s_addr = htonl(bindIP);
		if (bind(sock,(struct sockaddr *)&addr,sizeof(struct sockaddr_in)) != 0)
		{
			RTPCLOSE(sock);
			for (size_t i = 0 ; i < toClose.size() ; i++)
				RTPCLOSE(toClose[i]);
			return ERR_RTP_UDPV4TRANS_CANTGETVALIDSOCKET;
		}

		uint16_t basePort = 0;
		int status = GetIPv4SocketPort(sock, &basePort);
		if (status < 0)
		{
			RTPCLOSE(sock);
			for (size_t i = 0 ; i < toClose.size() ; i++)
				RTPCLOSE(toClose[i]);
			return status;
		}

		if (rtcpMux) // only need one socket
		{
			if (basePort%2 == 0 || allowOdd)
			{
				*pRtpSock = sock;
				*pRtcpSock = sock;
				*pRtpPort = basePort;
				*pRtcpPort = basePort;
				for (size_t i = 0 ; i < toClose.size() ; i++)
					RTPCLOSE(toClose[i]);

				return 0;
			}
			else
				toClose.push_back(sock);
		}
		else
		{
			SocketType sock2 = socket(PF_INET, SOCK_DGRAM, 0);
			if (sock2 == RTPSOCKERR)
			{
				RTPCLOSE(sock);
				for (size_t i = 0 ; i < toClose.size() ; i++)
					RTPCLOSE(toClose[i]);
				return ERR_RTP_UDPV4TRANS_CANTCREATESOCKET;
			}

			// Try the next port or the previous port
			uint16_t secondPort = basePort;
			bool possiblyValid = false;

			if (basePort%2 == 0)
			{
				secondPort++;
				possiblyValid = true;
			}
			else if (basePort > 1) // avoid landing on port 0
			{
				secondPort--;
				possiblyValid = true;
			}

			if (possiblyValid)
			{
				memset(&addr,0,sizeof(struct sockaddr_in));

				addr.sin_family = AF_INET;
				addr.sin_port = htons(secondPort);
				addr.sin_addr.s_addr = htonl(bindIP);
				if (bind(sock2,(struct sockaddr *)&addr,sizeof(struct sockaddr_in)) == 0)
				{
					// In this case, we have two consecutive port numbers, the lower of
					// which is even

					if (basePort < secondPort)
					{
						*pRtpSock = sock;
						*pRtcpSock = sock2;
						*pRtpPort = basePort;
						*pRtcpPort = secondPort;
					}
					else
					{
						*pRtpSock = sock2;
						*pRtcpSock = sock;
						*pRtpPort = secondPort;
						*pRtcpPort = basePort;
					}

					for (size_t i = 0 ; i < toClose.size() ; i++)
						RTPCLOSE(toClose[i]);

					return 0;
				}
			}

			toClose.push_back(sock);
			toClose.push_back(sock2);
		}
	}

	for (size_t i = 0 ; i < toClose.size() ; i++)
		RTPCLOSE(toClose[i]);

	return ERR_RTP_UDPV4TRANS_TOOMANYATTEMPTSCHOOSINGSOCKET;
}